

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O1

cio_error epoll_mod(cio_eventloop *loop,cio_event_notifier *evn,uint32_t events)

{
  int iVar1;
  cio_error cVar2;
  int *piVar3;
  epoll_event epoll_ev;
  undefined1 local_c [12];
  
  local_c._0_4_ = events;
  local_c._4_8_ = evn;
  iVar1 = epoll_ctl(loop->epoll_fd,3,evn->fd,(epoll_event *)local_c);
  cVar2 = CIO_SUCCESS;
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    cVar2 = -*piVar3;
  }
  return cVar2;
}

Assistant:

static enum cio_error epoll_mod(const struct cio_eventloop *loop, struct cio_event_notifier *evn, uint32_t events)
{
	struct epoll_event epoll_ev;

	epoll_ev.data.ptr = evn;
	epoll_ev.events = events;
	if (cio_unlikely(epoll_ctl(loop->epoll_fd, EPOLL_CTL_MOD, evn->fd, &epoll_ev) < 0)) {
		return (enum cio_error)(-errno);
	}

	return CIO_SUCCESS;
}